

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  uint p;
  undefined8 uVar1;
  Inst *this_00;
  uint uVar2;
  Frag FVar3;
  Frag a_00;
  uint uStack_58;
  int iStack_54;
  
  if ((a._8_8_ >> 0x20 & 1) == 0) {
    p = AllocInst(this,1);
    if ((int)p < 0) {
      uVar1 = 0;
      uStack_58 = 0;
      iStack_54 = (uint)iStack_54._1_3_ << 8;
    }
    else {
      this_00 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + p;
      uVar2 = p * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(this_00,0,a.begin);
      }
      else {
        Prog::Inst::InitAlt(this_00,a.begin,0);
        uVar2 = uVar2 | 1;
      }
      PatchList::Patch((this->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                       .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,a.end,p);
      uStack_58 = uVar2 / 1;
      iStack_54 = CONCAT31(iStack_54._1_3_,1);
      uVar1 = CONCAT44(uVar2,p);
    }
  }
  else {
    FVar3 = Plus(this,a,nongreedy);
    a_00._8_8_ = FVar3._8_8_ & 0xffffffffff;
    a_00.begin = (int)FVar3._0_8_;
    a_00.end.head = (int)((ulong)FVar3._0_8_ >> 0x20);
    FVar3 = Quest(this,a_00,nongreedy);
    uVar1 = FVar3._0_8_;
    uStack_58 = FVar3.end.tail;
    iStack_54 = CONCAT31(iStack_54._1_3_,FVar3.nullable);
  }
  FVar3._12_4_ = iStack_54;
  FVar3.end.tail = uStack_58;
  FVar3.begin = (int)uVar1;
  FVar3.end.head = (int)((ulong)uVar1 >> 0x20);
  return FVar3;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  // When the subexpression is nullable, one Alt isn't enough to guarantee
  // correct priority ordering within the transitive closure. The simplest
  // solution is to handle it as (a+)? instead, which adds the second Alt.
  if (a.nullable)
    return Quest(Plus(a, nongreedy), nongreedy);

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(id, pl, true);
}